

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O2

void Gia_ManDomTest(Gia_Man_t *p)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Wec_t *p_02;
  Vec_Wec_t *p_03;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_IntAlloc(100);
  p_02 = Gia_ManCreateSupps(p,1);
  p_03 = Vec_WecStart(p->nObjs);
  Gia_ManCreateRefs(p);
  Gia_ManComputeDoms(p);
  iVar12 = 0;
  while ((iVar12 < p->vCis->nSize && (pGVar7 = Gia_ManCi(p,iVar12), pGVar7 != (Gia_Obj_t *)0x0))) {
    iVar3 = Gia_ObjDom(p,pGVar7);
    if (iVar3 != -1) {
      while( true ) {
        iVar3 = Gia_ObjDom(p,pGVar7);
        pGVar7 = Gia_ManObj(p,iVar3);
        if (((int)(uint)*(undefined8 *)pGVar7 < 0) ||
           (((uint)*(undefined8 *)pGVar7 & 0x1fffffff) == 0x1fffffff)) break;
        iVar3 = Gia_ObjId(p,pGVar7);
        pVVar8 = Vec_WecEntry(p_03,iVar3);
        Vec_IntPush(pVVar8,iVar12);
      }
    }
    iVar12 = iVar12 + 1;
  }
  iVar12 = 0;
  do {
    if ((p->nObjs <= iVar12) || (pGVar7 = Gia_ManObj(p,iVar12), pGVar7 == (Gia_Obj_t *)0x0)) {
      Vec_WecFree(p_02);
      Vec_WecFree(p_03);
      iVar12 = p_00->nSize;
      iVar3 = 0;
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      for (; iVar12 != iVar3; iVar3 = iVar3 + 1) {
        iVar4 = Vec_IntEntry(p_00,iVar3);
        pGVar7 = Gia_ManObj(p,iVar4);
        Gia_ObjRefInc(p,pGVar7);
      }
      for (iVar3 = 0; iVar12 != iVar3; iVar3 = iVar3 + 1) {
        uVar5 = Vec_IntEntry(p_00,iVar3);
        pGVar7 = Gia_ManObj(p,uVar5);
        uVar6 = Gia_NodeMffcSizeSupp(p,pGVar7,p_01);
        printf("%d(%d:%d) ",(ulong)uVar5,(ulong)(uint)p_01->nSize,(ulong)uVar6);
      }
      putchar(10);
      for (iVar3 = 0; iVar12 != iVar3; iVar3 = iVar3 + 1) {
        iVar4 = Vec_IntEntry(p_00,iVar3);
        pGVar7 = Gia_ManObj(p,iVar4);
        Gia_ObjRefDec(p,pGVar7);
      }
      Vec_IntFree(p_00);
      Vec_IntFree(p_01);
      return;
    }
    if ((~*(uint *)pGVar7 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar7) {
      pVVar8 = Vec_WecEntry(p_02,iVar12);
      pVVar9 = Vec_WecEntry(p_03,iVar12);
      uVar5 = pVVar8->nSize;
      if (uVar5 == pVVar9->nSize) {
        uVar10 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar10 = 0;
        }
        uVar11 = 0;
        do {
          if (uVar10 == uVar11) {
            Vec_IntPush(p_00,iVar12);
            break;
          }
          piVar1 = pVVar8->pArray + uVar11;
          piVar2 = pVVar9->pArray + uVar11;
          uVar11 = uVar11 + 1;
        } while (*piVar1 == *piVar2);
      }
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

void Gia_ManDomTest( Gia_Man_t * p )
{
    Vec_Int_t * vDoms = Vec_IntAlloc( 100 );
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    Vec_Wec_t * vSupps = Gia_ManCreateSupps( p, 1 );
    Vec_Wec_t * vDomeds = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj, * pDom; int i, Id, nMffcSize;
    Gia_ManCreateRefs( p );
    Gia_ManComputeDoms( p );
    Gia_ManForEachCi( p, pObj, i )
    {
        if ( Gia_ObjDom(p, pObj) == -1 )
            continue;
        for ( pDom = Gia_ManObj(p, Gia_ObjDom(p, pObj)); Gia_ObjIsAnd(pDom); pDom = Gia_ManObj(p, Gia_ObjDom(p, pDom)) )
            Vec_IntPush( Vec_WecEntry(vDomeds, Gia_ObjId(p, pDom)), i );
    }
    Gia_ManForEachAnd( p, pObj, i )
        if ( Vec_IntEqual(Vec_WecEntry(vSupps, i), Vec_WecEntry(vDomeds, i)) )
            Vec_IntPush( vDoms, i );
    Vec_WecFree( vSupps );
    Vec_WecFree( vDomeds );

    // check MFFC sizes
    Vec_IntForEachEntry( vDoms, Id, i )
        Gia_ObjRefInc( p, Gia_ManObj(p, Id) );
    Vec_IntForEachEntry( vDoms, Id, i )
    {
        nMffcSize = Gia_NodeMffcSizeSupp( p, Gia_ManObj(p, Id), vSupp );
        printf( "%d(%d:%d) ", Id, Vec_IntSize(vSupp), nMffcSize );
    }
    printf( "\n" );
    Vec_IntForEachEntry( vDoms, Id, i )
        Gia_ObjRefDec( p, Gia_ManObj(p, Id) );

//    Vec_IntPrint( vDoms );
    Vec_IntFree( vDoms );
    Vec_IntFree( vSupp );
}